

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_warcry(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  CHAR_DATA *in_RDI;
  float fVar4;
  float chance;
  AFFECT_DATA af;
  AFFECT_DATA *paf;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char_data *in_stack_ffffffffffffff90;
  
  iVar2 = get_skill(ch,argument._4_4_);
  fVar4 = (float)iVar2;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    iVar2 = (int)in_RDI->level;
    paf = (AFFECT_DATA *)(skill_table + gsn_warcry);
    this = char_data::Class(in_stack_ffffffffffffff90);
    iVar3 = CClass::GetIndex(this);
    if (*(short *)((long)paf->bitvector + (long)iVar3 * 2 + -0x20) <= iVar2) {
      bVar1 = is_affected(in_RDI,(int)gsn_warcry);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffff90,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        return;
      }
      if (in_RDI->mana < 0x14) {
        send_to_char((char *)in_stack_ffffffffffffff90,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        return;
      }
      iVar3 = number_percent();
      if (fVar4 < (float)iVar3) {
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(fVar4,iVar2),paf,0);
        send_to_char((char *)in_stack_ffffffffffffff90,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,
                      af.tick_fun._4_4_);
        in_RDI->mana = in_RDI->mana + -10;
        WAIT_STATE(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        return;
      }
      act((char *)in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(fVar4,iVar2),paf,0);
      send_to_char((char *)in_stack_ffffffffffffff90,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,af.tick_fun._4_4_)
      ;
      init_affect((AFFECT_DATA *)0x5e74df);
      affect_to_char((CHAR_DATA *)CONCAT44(fVar4,iVar2),paf);
      affect_to_char((CHAR_DATA *)CONCAT44(fVar4,iVar2),paf);
      in_RDI->mana = in_RDI->mana + -0x14;
      WAIT_STATE(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffff90,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  return;
}

Assistant:

void do_warcry(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;

	float chance = get_skill(ch, gsn_warcry);

	if (chance == 0
		|| ch->level < skill_table[gsn_warcry].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to warcry properly.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_warcry))
	{
		send_to_char("You are already affected by a warcry.\n\r", ch);
		return;
	}

	if (ch->mana < 20)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}
	if (number_percent() > chance)
	{
		act("$n makes some soft grunting noises.", ch, 0, 0, TO_ROOM);
		send_to_char("You make soft grunting sounds but nothing happens.\n\r", ch);
		check_improve(ch, gsn_warcry, false, 2);
		ch->mana -= 10;

		WAIT_STATE(ch, 12);
		return;
	}

	act("$n lets out a blood freezing warcry!", ch, 0, 0, TO_ROOM);
	send_to_char("You let out a fierce warcry!\n\r", ch);
	check_improve(ch, gsn_warcry, true, 2);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_warcry;
	af.modifier = ch->level / 7;
	af.location = APPLY_HITROLL;
	af.duration = ch->level;
	af.level = ch->level;
	af.aftype = AFT_SKILL;
	affect_to_char(ch, &af);

	af.location = APPLY_SAVES;
	af.modifier = -(ch->level / 5);
	affect_to_char(ch, &af);

	ch->mana -= 20;
	WAIT_STATE(ch, 12);
}